

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.h
# Opt level: O1

void DepParserTask::get_hybrid_action_cost(search *sch,size_t idx,uint64_t n)

{
  int *piVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t i;
  long lVar9;
  ulong uVar10;
  
  pvVar3 = sch->task_data;
  lVar4 = *(long *)((long)pvVar3 + 0x98);
  lVar5 = *(long *)((long)pvVar3 + 0xa0);
  if (lVar5 - lVar4 == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(uint *)(lVar5 + -4);
  }
  uVar8 = lVar5 - lVar4 >> 2;
  lVar9 = 1;
  do {
    *(undefined4 *)(*(long *)((long)pvVar3 + 0x38) + lVar9 * 4) = 0;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  uVar10 = (ulong)uVar6;
  if ((*(long *)((long)pvVar3 + 0x98) != *(long *)((long)pvVar3 + 0xa0)) && (uVar8 != 1)) {
    lVar9 = 0;
    do {
      if (idx <= n) {
        uVar2 = *(uint *)(*(long *)((long)pvVar3 + 0x98) + lVar9 * 4);
        if ((*(uint *)(*(long *)((long)pvVar3 + 0x58) + (ulong)uVar2 * 4) == idx) ||
           (*(uint *)(*(long *)((long)pvVar3 + 0x58) + idx * 4) == uVar2)) {
          piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 4);
          *piVar1 = *piVar1 + 1;
        }
      }
      lVar9 = lVar9 + 1;
    } while (uVar8 - 1 != lVar9);
  }
  if ((lVar5 != lVar4) && (*(uint *)(*(long *)((long)pvVar3 + 0x58) + uVar10 * 4) == idx)) {
    piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 4);
    *piVar1 = *piVar1 + 1;
  }
  for (uVar7 = idx + 1; uVar7 <= n; uVar7 = uVar7 + 1) {
    if ((*(uint *)(*(long *)((long)pvVar3 + 0x58) + uVar7 * 4) == uVar6) ||
       (uVar7 == *(uint *)(*(long *)((long)pvVar3 + 0x58) + uVar10 * 4))) {
      piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 0xc);
      *piVar1 = *piVar1 + 1;
    }
  }
  if ((idx <= n && lVar5 != lVar4) && (*(uint *)(*(long *)((long)pvVar3 + 0x58) + idx * 4) == uVar6)
     ) {
    piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 0xc);
    *piVar1 = *piVar1 + 1;
  }
  if ((1 < uVar8) &&
     (*(int *)(*(long *)((long)pvVar3 + 0x58) + uVar10 * 4) ==
      *(int *)(*(long *)((long)pvVar3 + 0x98) + -8 + (lVar5 - lVar4)))) {
    piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 0xc);
    *piVar1 = *piVar1 + 1;
  }
  if (idx <= *(uint *)(*(long *)((long)pvVar3 + 0x58) + uVar10 * 4)) {
    piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 8);
    *piVar1 = *piVar1 + 1;
  }
  for (; idx <= n; idx = idx + 1) {
    if (*(uint *)(*(long *)((long)pvVar3 + 0x58) + idx * 4) == uVar6) {
      piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 8);
      *piVar1 = *piVar1 + 1;
    }
  }
  return;
}

Assistant:

T* get_task_data()
  {
    return (T*)task_data;
  }